

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

int Kit_TruthToGia(Gia_Man_t *pMan,uint *pTruth,int nVars,Vec_Int_t *vMemory,Vec_Int_t *vLeaves,
                  int fHash)

{
  int iVar1;
  Vec_Int_t *vMemory_00;
  Kit_Graph_t *local_40;
  Kit_Graph_t *pGraph;
  int iLit;
  int fHash_local;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth_local;
  Gia_Man_t *pMan_local;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = Vec_IntAlloc(0);
    local_40 = Kit_TruthToGraph(pTruth,nVars,vMemory_00);
    Vec_IntFree(vMemory_00);
  }
  else {
    local_40 = Kit_TruthToGraph(pTruth,nVars,vMemory);
  }
  if (local_40 == (Kit_Graph_t *)0x0) {
    printf("Kit_TruthToGia(): Converting truth table to AIG has failed for function:\n");
    Kit_DsdPrintFromTruth(pTruth,nVars);
    printf("\n");
  }
  iVar1 = Kit_GraphToGia(pMan,local_40,vLeaves,fHash);
  Kit_GraphFree(local_40);
  return iVar1;
}

Assistant:

int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash )
{
    int iLit;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    if ( pGraph == NULL )
    {
        printf( "Kit_TruthToGia(): Converting truth table to AIG has failed for function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    }
    // derive the AIG for the decomposition tree
    iLit = Kit_GraphToGia( pMan, pGraph, vLeaves, fHash );
    Kit_GraphFree( pGraph );
    return iLit;
}